

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_common.c
# Opt level: O2

void av1_loop_restoration_filter_frame_mt
               (YV12_BUFFER_CONFIG *frame,AV1_COMMON *cm,int optimized_lr,AVxWorker *workers,
               int num_workers,AV1LrSync *lr_sync,void *lr_ctxt,int do_extend_border)

{
  uint8_t uVar1;
  int iVar2;
  int iVar3;
  SequenceHeader *pSVar4;
  AV1LrMTInfo *pAVar5;
  LRWorkerData *pLVar6;
  long lVar7;
  AVxWorker *pAVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  AVxWorkerInterface *pAVar12;
  int iVar13;
  long lVar14;
  uint uVar15;
  long lVar16;
  int *piVar17;
  RestorationInfo *pRVar18;
  long lVar19;
  AVxWorker *pAVar20;
  AV1LrSync *pAVar21;
  int iVar22;
  uint uVar23;
  ulong uVar24;
  int iVar25;
  bool bVar26;
  AVxWorker *worker;
  aom_internal_error_info error_info;
  
  pAVar21 = lr_sync;
  av1_loop_restoration_filter_frame_init
            ((AV1LrStruct *)lr_ctxt,frame,cm,optimized_lr,
             (uint)(cm->seq_params->monochrome == '\0') * 2 + 1);
  uVar23 = (uint)(cm->seq_params->monochrome == '\0') * 2 + 1;
  pAVar12 = aom_get_worker_interface();
  piVar17 = &cm->rst_info[0].restoration_unit_size;
  iVar10 = 0;
  for (lVar16 = 0; iVar11 = (int)pAVar21, (ulong)uVar23 * 0x38 != lVar16; lVar16 = lVar16 + 0x38) {
    if (((RestorationInfo *)(piVar17 + -1))->frame_restoration_type != RESTORE_NONE) {
      iVar11 = *(int *)((long)lr_ctxt + lVar16 + 0x1c);
      iVar2 = *piVar17;
      iVar9 = av1_lr_count_units(iVar2,iVar11);
      if (iVar10 <= iVar9) {
        iVar10 = av1_lr_count_units(iVar2,iVar11);
      }
    }
    piVar17 = piVar17 + 0x10;
  }
  if ((((lr_sync->sync_range == 0) || (lr_sync->rows < iVar10)) ||
      (lr_sync->num_workers < num_workers)) || (lr_sync->num_planes < (int)uVar23)) {
    av1_loop_restoration_dealloc(lr_sync);
    av1_loop_restoration_alloc(lr_sync,cm,num_workers,iVar10,uVar23,iVar11);
  }
  lr_sync->lr_mt_exit = false;
  for (uVar24 = 0; uVar23 != uVar24; uVar24 = uVar24 + 1) {
    memset(lr_sync->cur_sb_col[uVar24],0xff,(long)iVar10 << 2);
  }
  pSVar4 = cm->seq_params;
  uVar1 = pSVar4->monochrome;
  pAVar5 = lr_sync->job_queue;
  lr_sync->jobs_enqueued = 0;
  lr_sync->jobs_dequeued = 0;
  lVar16 = (ulong)(uVar1 == '\0') * 2 + 1;
  error_info.has_detail = 0;
  pRVar18 = cm->rst_info;
  for (lVar14 = 0; lVar16 * 0x38 - lVar14 != 0; lVar14 = lVar14 + 0x38) {
    if (pRVar18->frame_restoration_type != RESTORE_NONE) {
      error_info.has_detail =
           error_info.has_detail + (*(int *)(*(long *)((long)lr_ctxt + lVar14 + 8) + 0xc) + 1 >> 1);
    }
    pRVar18 = pRVar18 + 1;
  }
  error_info.error_code = AOM_CODEC_OK;
  iVar10 = 0;
  for (lVar14 = 0; lVar14 != lVar16; lVar14 = lVar14 + 1) {
    if (cm->rst_info[lVar14].frame_restoration_type != RESTORE_NONE) {
      uVar23 = 0;
      bVar26 = false;
      if (lVar14 != 0) {
        bVar26 = pSVar4->subsampling_y != 0;
      }
      lVar19 = *(long *)((long)lr_ctxt + lVar14 * 0x38 + 8);
      iVar11 = *(int *)(lVar19 + 4);
      iVar2 = *(int *)((long)lr_ctxt + lVar14 * 0x38 + 0x1c);
      iVar9 = 0;
      while (iVar13 = iVar2 - iVar9, iVar13 != 0 && iVar9 <= iVar2) {
        if ((iVar11 * 3) / 2 <= iVar13) {
          iVar13 = iVar11;
        }
        iVar13 = iVar13 + iVar9;
        iVar9 = iVar9 - (8U >> bVar26);
        iVar22 = 0;
        if (0 < iVar9) {
          iVar22 = iVar9;
        }
        uVar15 = 0;
        if (iVar13 < iVar2) {
          uVar15 = 8U >> bVar26;
        }
        iVar25 = iVar13 - uVar15;
        uVar15 = uVar23 & 1;
        iVar3 = *(int *)(error_info.detail + (ulong)uVar15 * 4 + -8);
        pAVar5[iVar3].lr_unit_row = uVar23;
        pAVar5[iVar3].plane = (int)lVar14;
        pAVar5[iVar3].v_start = iVar22;
        pAVar5[iVar3].v_end = iVar25;
        pAVar5[iVar3].sync_mode = uVar15;
        if ((uVar23 & 1) == 0) {
          pAVar5[iVar3].v_copy_start = iVar22 + 3;
          pAVar5[iVar3].v_copy_end = iVar25 + -3;
          if (uVar23 == 0) {
            pAVar5[iVar3].v_copy_start = 0;
          }
          if (uVar23 == *(int *)(lVar19 + 0xc) - 1U) {
            pAVar5[iVar3].v_copy_end = iVar2;
          }
        }
        else {
          if (iVar9 < 4) {
            iVar9 = 3;
          }
          pAVar5[iVar3].v_copy_start = iVar9 + -3;
          iVar9 = iVar25 + 3;
          if (iVar2 <= iVar25 + 3) {
            iVar9 = iVar2;
          }
          pAVar5[iVar3].v_copy_end = iVar9;
        }
        *(int *)(error_info.detail + (ulong)uVar15 * 4 + -8) = iVar3 + 1;
        iVar10 = iVar10 + 1;
        lr_sync->jobs_enqueued = iVar10;
        uVar23 = uVar23 + 1;
        iVar9 = iVar13;
      }
    }
  }
  uVar24 = (ulong)(uint)num_workers;
  lVar19 = uVar24 * 0x1c0;
  lVar14 = 0;
  lVar16 = lVar19;
  for (; 0 < num_workers; num_workers = num_workers + -1) {
    lVar7 = lVar14 + uVar24 * 0x38;
    pLVar6 = lr_sync->lrworkerdata;
    *(void **)((long)pLVar6 + lVar14 * 8 + lVar19 + -0x1b0) = lr_ctxt;
    *(int *)((long)pLVar6 + lVar14 * 8 + lVar19 + -0x1a8) = do_extend_border;
    *(code **)((long)workers + lVar7 + -0x20) = loop_restoration_row_worker;
    *(AV1LrSync **)((long)workers + lVar7 + -0x18) = lr_sync;
    *(char **)((long)workers + lVar7 + -0x10) = pLVar6[-1].error_info.detail + lVar16 + -0x28;
    *(undefined4 *)((long)workers + lVar7 + -8) = 0;
    (*(&pAVar12->launch)[uVar24 * 0x38 + lVar14 == 0x38])
              ((AVxWorker *)((long)&workers[uVar24 - 1].impl_ + lVar14));
    lVar14 = lVar14 + -0x38;
    lVar16 = lVar16 + -0x1c0;
  }
  pAVar12 = aom_get_worker_interface();
  iVar10 = workers->had_error;
  if (iVar10 != 0) {
    memcpy(&error_info,(void *)((long)workers->data2 + 0x20),0x1a0);
  }
  bVar26 = iVar10 == 0;
  do {
    iVar10 = (int)uVar24 + 1;
    pAVar8 = workers + (uVar24 - 1);
    do {
      pAVar20 = pAVar8;
      iVar10 = iVar10 + -1;
      if (iVar10 < 2) {
        if (!bVar26) {
          aom_internal_error_copy(cm->error,&error_info);
        }
        return;
      }
      uVar24 = uVar24 - 1;
      iVar11 = (*pAVar12->sync)(pAVar20);
      pAVar8 = pAVar20 + -1;
    } while (iVar11 != 0);
    memcpy(&error_info,(void *)((long)pAVar20->data2 + 0x20),0x1a0);
    bVar26 = false;
  } while( true );
}

Assistant:

void av1_loop_restoration_filter_frame_mt(YV12_BUFFER_CONFIG *frame,
                                          AV1_COMMON *cm, int optimized_lr,
                                          AVxWorker *workers, int num_workers,
                                          AV1LrSync *lr_sync, void *lr_ctxt,
                                          int do_extend_border) {
  assert(!cm->features.all_lossless);

  const int num_planes = av1_num_planes(cm);

  AV1LrStruct *loop_rest_ctxt = (AV1LrStruct *)lr_ctxt;

  av1_loop_restoration_filter_frame_init(loop_rest_ctxt, frame, cm,
                                         optimized_lr, num_planes);

  foreach_rest_unit_in_planes_mt(loop_rest_ctxt, workers, num_workers, lr_sync,
                                 cm, do_extend_border);
}